

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

bool compare(string *left,string *right,bool sensitive)

{
  char *__s1;
  char *__s2;
  int iVar1;
  bool sensitive_local;
  string *right_local;
  string *left_local;
  
  if (sensitive) {
    left_local._7_1_ = std::operator==(left,right);
  }
  else {
    __s1 = (char *)std::__cxx11::string::c_str();
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcasecmp(__s1,__s2);
    left_local._7_1_ = iVar1 == 0;
  }
  return left_local._7_1_;
}

Assistant:

bool compare (
  const std::string& left,
  const std::string& right,
  bool sensitive /*= true*/)
{
  // Use strcasecmp if required.
  if (! sensitive)
    return strcasecmp (left.c_str (), right.c_str ()) == 0;

  // Otherwise, just use std::string::operator==.
  return left == right;
}